

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
IR::IRBuilder::cjump(IRBuilder *this,Expr *cond,BasicBlock *iftrue,BasicBlock *iffalse)

{
  BasicBlock *this_00;
  bool bVar1;
  reference local_30;
  BasicBlock *local_28;
  BasicBlock *iffalse_local;
  BasicBlock *iftrue_local;
  Expr *cond_local;
  IRBuilder *this_local;
  
  local_28 = iffalse;
  iffalse_local = iftrue;
  iftrue_local = (BasicBlock *)cond;
  cond_local = (Expr *)this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::CJump,std::allocator<IR::CJump>>::
    emplace_front<IR::Expr_const*&,IR::BasicBlock*&,IR::BasicBlock*&>
              ((forward_list<IR::CJump,std::allocator<IR::CJump>> *)&this->function_->cjumps_,
               (Expr **)&iftrue_local,&iffalse_local,&local_28);
    this_00 = this->block_;
    local_30 = std::forward_list<IR::CJump,_std::allocator<IR::CJump>_>::front
                         (&this->function_->cjumps_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_30);
  }
  return;
}

Assistant:

void IRBuilder::cjump(const Expr* cond, BasicBlock* iftrue,
                      BasicBlock* iffalse) {
  if (block_->isTerminated()) return;
  function_->cjumps_.emplace_front(cond, iftrue, iffalse);
  block_->push_back(&function_->cjumps_.front());
}